

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O1

Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_8UL,_void,_void>_>
* __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_8UL,_void,_void>_>
::operator*=(Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_8UL,_void,_void>_>
             *this,uint v)

{
  pointer ppEVar1;
  uint uVar2;
  stored_size_type sVar3;
  Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>
  *__v;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>_>_>_>
  *this_00;
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>>
  *this_01;
  _Base_ptr p_Var4;
  iterator __position;
  invalid_argument *this_02;
  _Base_ptr p_Var5;
  const_iterator __position_00;
  pointer ppEVar6;
  bool bVar7;
  ID_index local_3c;
  _Alloc_node local_38;
  
  uVar2 = this->operators_->characteristic_;
  if (uVar2 <= v) {
    v = v % uVar2;
  }
  if (v != 1) {
    if (v == 0) {
      this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_02,"A chain column should not be multiplied by 0.");
      __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    sVar3 = (this->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_size;
    if (sVar3 != 0) {
      ppEVar6 = (this->column_).
                super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
                .super_type.m_holder.m_start;
      ppEVar1 = ppEVar6 + sVar3;
      do {
        if (ppEVar6 == (pointer)0x0) {
          __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                        "reference boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> **, false>::operator*() const [Pointer = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> **, IsConst = false]"
                       );
        }
        __v = *ppEVar6;
        persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                  (this->operators_,&(__v->super_Entry_field_element_option).element_,v);
        this_00 = (this->super_Row_access_option).rows_;
        if (this_00 !=
            (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>_>_>_>
             *)0x0) {
          local_3c = __v->rowIndex_;
          this_01 = (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>>
                     *)std::
                       map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>_>_>_>
                       ::at(this_00,&local_3c);
          p_Var5 = *(_Base_ptr *)(this_01 + 0x10);
          __position_00._M_node = (_Base_ptr)(this_01 + 8);
          p_Var4 = __position_00._M_node;
          if (p_Var5 != (_Base_ptr)0x0) {
            do {
              bVar7 = p_Var5[1]._M_color < (__v->super_Entry_column_index_option).columnIndex_;
              if (!bVar7) {
                p_Var4 = p_Var5;
              }
              p_Var5 = (&p_Var5->_M_left)[bVar7];
            } while (p_Var5 != (_Base_ptr)0x0);
          }
          if ((p_Var4 != __position_00._M_node) &&
             (p_Var4[1]._M_color <= (__v->super_Entry_column_index_option).columnIndex_)) {
            __position_00._M_node = p_Var4;
          }
          __position = std::
                       _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>>
                       ::erase_abi_cxx11_(this_01,__position_00);
          local_38._M_t =
               (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>
                *)this_01;
          std::
          _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>>
          ::
          _M_insert_unique_<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>const&,std::_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>>::_Alloc_node>
                    (this_01,(const_iterator)__position._M_node,__v,&local_38);
        }
        ppEVar6 = ppEVar6 + 1;
      } while (ppEVar6 != ppEVar1);
    }
  }
  return this;
}

Assistant:

inline Naive_vector_column<Master_matrix,Support>& Naive_vector_column<Master_matrix,Support>::operator*=(unsigned int v)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    if (v % 2 == 0) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        throw std::invalid_argument("A chain column should not be multiplied by 0.");
      } else {
        clear();
      }
    }
  } else {
    Field_element val = operators_->get_value(v);

    if (val == Field_operators::get_additive_identity()) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        throw std::invalid_argument("A chain column should not be multiplied by 0.");
      } else {
        clear();
      }
      return *this;
    }

    if (val == Field_operators::get_multiplicative_identity()) return *this;

    for (Entry* entry : column_) {
      operators_->multiply_inplace(entry->get_element(), val);
      if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::update_entry(*entry);
    }
  }

  return *this;
}